

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

void chacha20poly1305_finalize(chacha20poly1305_context_t *ctx,uint8_t *tag)

{
  uint8_t local_28 [8];
  uint8_t lenbuf [16];
  uint8_t *tag_local;
  chacha20poly1305_context_t *ctx_local;
  
  lenbuf._8_8_ = tag;
  chacha20poly1305_encrypt_pad(&ctx->poly,ctx->textlen);
  write64_le(ctx->aadlen,local_28);
  write64_le(ctx->textlen,lenbuf);
  cf_poly1305_update(&ctx->poly,local_28,0x10);
  cf_poly1305_finish(&ctx->poly,(uint8_t *)lenbuf._8_8_);
  return;
}

Assistant:

static void chacha20poly1305_finalize(struct chacha20poly1305_context_t *ctx, uint8_t *tag)
{
    uint8_t lenbuf[16];

    chacha20poly1305_encrypt_pad(&ctx->poly, ctx->textlen);

    write64_le(ctx->aadlen, lenbuf);
    write64_le(ctx->textlen, lenbuf + 8);
    cf_poly1305_update(&ctx->poly, lenbuf, sizeof(lenbuf));

    cf_poly1305_finish(&ctx->poly, tag);
}